

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

uchar __thiscall smf::MidiFile::readByte(MidiFile *this,istream *input)

{
  ulong uVar1;
  ostream *this_00;
  uchar local_21;
  istream *piStack_20;
  uchar buffer [1];
  istream *input_local;
  MidiFile *this_local;
  
  piStack_20 = input;
  memset(&local_21,0,1);
  std::istream::read((char *)piStack_20,(long)&local_21);
  uVar1 = std::ios::eof();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = local_21;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"Error: unexpected end of file.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->m_rwstatus = false;
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

uchar MidiFile::readByte(std::istream& input) {
	uchar buffer[1] = {0};
	input.read((char*)buffer, 1);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		m_rwstatus = false;
		return 0;
	}
	return buffer[0];
}